

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

bool __thiscall
ON_DimStyle::Internal_SetDoubleMember
          (ON_DimStyle *this,field field_id,double value,double *class_member)

{
  double dVar1;
  bool bVar2;
  
  bVar2 = ON_IsValid(value);
  if (bVar2) {
    dVar1 = *class_member;
    bVar2 = (bool)(-(value != dVar1) & 1);
    if ((dVar1 != value) || (NAN(dVar1) || NAN(value))) {
      *class_member = value;
      Internal_ContentChange(this);
    }
    Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_DimStyle::Internal_SetDoubleMember(
  ON_DimStyle::field field_id,
  double value,
  double& class_member
)
{
  bool bValueChanged = false;
  if (ON_IsValid(value))
  {
    // !(value == class_member) is used instead of (value != class_member)
    // so that when class_member = NaN, its value can be changed.
    if ( !(value == class_member) )
    {
      class_member = value;
      Internal_ContentChange();
      bValueChanged = true;
    }
    Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  }
  return bValueChanged;
}